

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bytedata.cpp
# Opt level: O0

void __thiscall ByteData_BytesConstructor_Test::TestBody(ByteData_BytesConstructor_Test *this)

{
  pointer puVar1;
  bool bVar2;
  pointer puVar3;
  byte *pbVar4;
  char *pcVar5;
  char *in_R9;
  AssertHelper local_1d0;
  Message local_1c8;
  ByteData local_1c0;
  string local_1a8;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_158;
  Message local_150;
  bool local_141;
  undefined1 local_140 [8];
  AssertionResult gtest_ar__1;
  Message local_128;
  size_type local_120;
  size_t local_118;
  undefined1 local_110 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_e0;
  Message local_d8;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_;
  Message local_b8;
  string local_b0;
  undefined1 local_90 [8];
  AssertionResult gtest_ar;
  bool local_61;
  undefined1 local_60 [7];
  bool is_equals;
  ByteData byte_data;
  size_t i;
  uint8_t byte;
  allocator<unsigned_char> local_29;
  undefined1 local_28 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> target;
  ByteData_BytesConstructor_Test *this_local;
  
  target.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<unsigned_char>::allocator(&local_29);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,0x14,&local_29);
  std::allocator<unsigned_char>::~allocator(&local_29);
  i._3_1_ = 1;
  for (byte_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      puVar1 = byte_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage,
      puVar3 = (pointer)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28
                                  ), puVar1 < puVar3;
      byte_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           byte_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage + 1) {
    pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,
                        (size_type)
                        byte_data.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    *pbVar4 = i._3_1_;
    i._3_1_ = i._3_1_ + 1;
    if (9 < i._3_1_) {
      i._3_1_ = 0;
    }
  }
  cfd::core::ByteData::ByteData
            ((ByteData *)local_60,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28)
  ;
  cfd::core::ByteData::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar.message_,
             (ByteData *)local_60);
  bVar2 = std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          &gtest_ar.message_,
                          (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar.message_);
  local_61 = bVar2;
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_b0,(ByteData *)local_60);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_90,"byte_data.GetHex().c_str()",
             "\"0102030405060708090001020304050607080900\"",pcVar5,
             "0102030405060708090001020304050607080900");
  std::__cxx11::string::~string((string *)&local_b0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar2) {
    testing::Message::Message(&local_b8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_bytedata.cpp"
               ,0x41,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_d0,&local_61,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar2) {
    testing::Message::Message(&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_d0,(AssertionResult *)"is_equals",
               "false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_bytedata.cpp"
               ,0x42,pcVar5);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  local_118 = cfd::core::ByteData::GetDataSize((ByteData *)local_60);
  local_120 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_110,"byte_data.GetDataSize()","target.size()",&local_118,
             &local_120);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar2) {
    testing::Message::Message(&local_128);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_bytedata.cpp"
               ,0x43,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  bVar2 = cfd::core::ByteData::IsEmpty((ByteData *)local_60);
  local_141 = (bool)(~bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_140,&local_141,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar2) {
    testing::Message::Message(&local_150);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_2.message_,(internal *)local_140,
               (AssertionResult *)"byte_data.IsEmpty()","true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_bytedata.cpp"
               ,0x44,pcVar5);
    testing::internal::AssertHelper::operator=(&local_158,&local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  cfd::core::ByteData::Serialize(&local_1c0,(ByteData *)local_60);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_1a8,&local_1c0);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_188,"byte_data.Serialize().GetHex().c_str()",
             "\"140102030405060708090001020304050607080900\"",pcVar5,
             "140102030405060708090001020304050607080900");
  std::__cxx11::string::~string((string *)&local_1a8);
  cfd::core::ByteData::~ByteData(&local_1c0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
  if (!bVar2) {
    testing::Message::Message(&local_1c8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_bytedata.cpp"
               ,0x47,pcVar5);
    testing::internal::AssertHelper::operator=(&local_1d0,&local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    testing::Message::~Message(&local_1c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
  cfd::core::ByteData::~ByteData((ByteData *)local_60);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  return;
}

Assistant:

TEST(ByteData, BytesConstructor) {
  std::vector<uint8_t> target(20);
  uint8_t byte = 1;
  for (size_t i = 0; i < target.size(); i++) {
    target[i] = byte;
    byte++;
    if (byte > 9) {
      byte = 0;
    }
  }
  ByteData byte_data = ByteData(target);
  bool is_equals = (byte_data.GetBytes() == target);

  EXPECT_STREQ(byte_data.GetHex().c_str(),
               "0102030405060708090001020304050607080900");
  EXPECT_TRUE(is_equals);
  EXPECT_EQ(byte_data.GetDataSize(), target.size());
  EXPECT_FALSE(byte_data.IsEmpty());
  EXPECT_STREQ(
    byte_data.Serialize().GetHex().c_str(),
    "140102030405060708090001020304050607080900");
}